

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerImpl::CommandDomainReset
          (CommissionerImpl *this,ErrorHandler *aHandler,string *aDstAddr)

{
  char cVar1;
  ErrorCode EVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  string local_120;
  writer write;
  undefined1 local_f8 [8];
  char *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  format_string_checker<char> *local_d8;
  parse_func local_d0 [1];
  Error error;
  function<void_(ot::commissioner::Error)> local_a0;
  undefined1 local_80 [40];
  undefined1 local_58 [40];
  
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[9])();
  if ((char)iVar3 == '\0') {
    local_f8._0_4_ = none_type;
    local_f0 = "the commissioner is not active";
    local_e8._M_allocated_capacity = 0x1e;
    local_e8._8_8_ = 0;
    local_d0[0] = (parse_func)0x0;
    pcVar4 = "the commissioner is not active";
    local_d8 = (format_string_checker<char> *)local_f8;
    while (pcVar5 = pcVar4, pcVar5 != "") {
      pcVar4 = pcVar5 + 1;
      if (*pcVar5 == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = pcVar5 + 2;
      }
      else if (*pcVar5 == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar5,"",(format_string_checker<char> *)local_f8);
      }
    }
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_f8;
    ::fmt::v10::vformat_abi_cxx11_(&local_120,(v10 *)0x1f85d8,(string_view)ZEXT816(0x1e),args);
    local_80._0_4_ = kInvalidState;
    std::__cxx11::string::string((string *)(local_80 + 8),(string *)&local_120);
  }
  else {
    iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
    if ((char)iVar3 != '\0') {
      std::function<void_(ot::commissioner::Error)>::function(&local_a0,aHandler);
      std::__cxx11::string::string((string *)local_f8,"/c/rt",(allocator *)local_80);
      SendProxyMessage(this,&local_a0,aDstAddr,(string *)local_f8);
      std::__cxx11::string::~string((string *)local_f8);
      std::_Function_base::~_Function_base(&local_a0.super__Function_base);
      goto LAB_001766dc;
    }
    local_f8._0_4_ = none_type;
    local_f0 = "resetting a device is not in CCM Mode";
    local_e8._M_allocated_capacity = 0x25;
    local_e8._8_8_ = 0;
    local_d0[0] = (parse_func)0x0;
    pcVar4 = "resetting a device is not in CCM Mode";
    write.handler_ = (format_string_checker<char> *)local_f8;
    local_d8 = (format_string_checker<char> *)local_f8;
    while (pcVar4 != "") {
      cVar1 = *pcVar4;
      pcVar5 = pcVar4;
      while (cVar1 != '{') {
        pcVar5 = pcVar5 + 1;
        if (pcVar5 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,pcVar4,"");
          goto LAB_00176680;
        }
        cVar1 = *pcVar5;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,pcVar4,pcVar5);
      pcVar4 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar5,"",(format_string_checker<char> *)local_f8);
    }
LAB_00176680:
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_f8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_120,(v10 *)"resetting a device is not in CCM Mode",(string_view)ZEXT816(0x25),
               args_00);
    local_80._0_4_ = kInvalidState;
    std::__cxx11::string::string((string *)(local_80 + 8),(string *)&local_120);
  }
  Error::operator=(&error,(Error *)local_80);
  std::__cxx11::string::~string((string *)(local_80 + 8));
  std::__cxx11::string::~string((string *)&local_120);
LAB_001766dc:
  EVar2 = error.mCode;
  local_f8._0_4_ = none_type;
  local_f0 = local_e8._M_local_buf + 8;
  local_e8._M_allocated_capacity = 0;
  local_e8._8_8_ = local_e8._8_8_ & 0xffffffffffffff00;
  std::__cxx11::string::~string((string *)&local_f0);
  if (EVar2 != kNone) {
    Error::Error((Error *)local_58,&error);
    std::function<void_(ot::commissioner::Error)>::operator()(aHandler,(Error *)local_58);
    std::__cxx11::string::~string((string *)(local_58 + 8));
  }
  std::__cxx11::string::~string((string *)&error.mMessage);
  return;
}

Assistant:

void CommissionerImpl::CommandDomainReset(ErrorHandler aHandler, const std::string &aDstAddr)
{
    Error error;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));
    VerifyOrExit(IsCcmMode(), error = ERROR_INVALID_STATE("resetting a device is not in CCM Mode"));
    SendProxyMessage(aHandler, aDstAddr, uri::kMgmtDomainReset);

exit:
    if (error != ERROR_NONE)
    {
        aHandler(error);
    }
}